

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ieee.h
# Opt level: O0

void __thiscall
double_conversion::Single::NormalizedBoundaries(Single *this,DiyFp *out_m_minus,DiyFp *out_m_plus)

{
  bool bVar1;
  char cVar2;
  int32_t iVar3;
  uint64_t uVar4;
  uint64_t *in_RDX;
  uint64_t *in_RSI;
  DiyFp DVar5;
  DiyFp m_minus;
  DiyFp m_plus;
  DiyFp v;
  DiyFp *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  DiyFp local_98;
  DiyFp local_88;
  DiyFp local_78;
  uint64_t local_68;
  int32_t local_60;
  DiyFp local_58;
  DiyFp local_48;
  uint64_t local_38;
  int32_t local_30;
  DiyFp local_28;
  uint64_t *local_18;
  uint64_t *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  DVar5 = AsDiyFp((Single *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
  local_38 = DVar5.f_;
  local_30 = DVar5.e_;
  local_28.f_ = local_38;
  local_28.e_ = local_30;
  uVar4 = DiyFp::f(&local_28);
  iVar3 = DiyFp::e(&local_28);
  DiyFp::DiyFp(&local_58,uVar4 * 2 + 1,iVar3 + -1);
  DVar5 = DiyFp::Normalize(in_stack_ffffffffffffff28);
  local_68 = DVar5.f_;
  local_60 = DVar5.e_;
  local_48.f_ = local_68;
  local_48.e_ = local_60;
  DiyFp::DiyFp(&local_78);
  bVar1 = LowerBoundaryIsCloser
                    ((Single *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
  if (bVar1) {
    uVar4 = DiyFp::f(&local_28);
    iVar3 = DiyFp::e(&local_28);
    DiyFp::DiyFp(&local_88,uVar4 * 4 - 1,iVar3 + -2);
    local_78.f_ = local_88.f_;
    local_78.e_ = local_88.e_;
  }
  else {
    uVar4 = DiyFp::f(&local_28);
    iVar3 = DiyFp::e(&local_28);
    DiyFp::DiyFp(&local_98,uVar4 * 2 - 1,iVar3 + -1);
    local_78.f_ = local_98.f_;
    local_78.e_ = local_98.e_;
  }
  uVar4 = DiyFp::f(&local_78);
  iVar3 = DiyFp::e(&local_78);
  cVar2 = (char)iVar3;
  iVar3 = DiyFp::e(&local_48);
  DiyFp::set_f(&local_78,uVar4 << (cVar2 - (char)iVar3 & 0x3fU));
  iVar3 = DiyFp::e(&local_48);
  DiyFp::set_e(&local_78,iVar3);
  *local_18 = local_48.f_;
  *(int32_t *)(local_18 + 1) = local_48.e_;
  *local_10 = local_78.f_;
  *(int32_t *)(local_10 + 1) = local_78.e_;
  return;
}

Assistant:

void NormalizedBoundaries(DiyFp* out_m_minus, DiyFp* out_m_plus) const {
    DOUBLE_CONVERSION_ASSERT(value() > 0.0);
    DiyFp v = this->AsDiyFp();
    DiyFp m_plus = DiyFp::Normalize(DiyFp((v.f() << 1) + 1, v.e() - 1));
    DiyFp m_minus;
    if (LowerBoundaryIsCloser()) {
      m_minus = DiyFp((v.f() << 2) - 1, v.e() - 2);
    } else {
      m_minus = DiyFp((v.f() << 1) - 1, v.e() - 1);
    }
    m_minus.set_f(m_minus.f() << (m_minus.e() - m_plus.e()));
    m_minus.set_e(m_plus.e());
    *out_m_plus = m_plus;
    *out_m_minus = m_minus;
  }